

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeesPdu.cpp
# Opt level: O2

void __thiscall DIS::SeesPdu::~SeesPdu(SeesPdu *this)

{
  (this->super_DistributedEmissionsFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__SeesPdu_001b1ff0;
  std::vector<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>::clear
            (&this->_propulsionSystemData);
  std::vector<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>::
  clear(&this->_vectoringSystemData);
  std::vector<DIS::VectoringNozzleSystemData,_std::allocator<DIS::VectoringNozzleSystemData>_>::
  ~vector(&this->_vectoringSystemData);
  std::vector<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>::~vector
            (&this->_propulsionSystemData);
  EntityID::~EntityID(&this->_orginatingEntityID);
  DistributedEmissionsFamilyPdu::~DistributedEmissionsFamilyPdu
            (&this->super_DistributedEmissionsFamilyPdu);
  return;
}

Assistant:

SeesPdu::~SeesPdu()
{
    _propulsionSystemData.clear();
    _vectoringSystemData.clear();
}